

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_find_high_bit_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id IVar2;
  uint uVar3;
  Builder *this;
  Value *value;
  Operation *this_00;
  Type *pTVar4;
  Operation *this_01;
  Operation *this_02;
  initializer_list<unsigned_int> local_50;
  Id local_3c;
  Id local_38;
  Id local_34;
  
  this = Converter::Impl::builder(impl);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = emit_native_bitscan(opcode,impl,(Instruction *)0x0,value);
  IVar2 = spv::Builder::makeBoolType(this);
  this_00 = Converter::Impl::allocate(impl,OpIEqual,IVar2);
  local_3c = IVar1;
  local_38 = spv::Builder::makeUintConstant(this,0xffffffff,false);
  local_50._M_len = 2;
  local_50._M_array = &local_3c;
  Operation::add_ids(this_00,&local_50);
  Converter::Impl::add(impl,this_00,false);
  pTVar4 = LLVMBC::Value::getType((Value *)instruction);
  IVar2 = Converter::Impl::get_type_id(impl,pTVar4,0);
  this_01 = Converter::Impl::allocate(impl,OpISub,IVar2);
  pTVar4 = LLVMBC::Value::getType(value);
  uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar4);
  local_3c = spv::Builder::makeUintConstant(this,uVar3 - 1,false);
  local_50._M_len = 2;
  local_50._M_array = &local_3c;
  local_38 = IVar1;
  Operation::add_ids(this_01,&local_50);
  Converter::Impl::add(impl,this_01,false);
  this_02 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  local_3c = this_00->id;
  local_38 = spv::Builder::makeUintConstant(this,0xffffffff,false);
  local_34 = this_01->id;
  local_50._M_len = 3;
  local_50._M_array = &local_3c;
  Operation::add_ids(this_02,&local_50);
  Converter::Impl::add(impl,this_02,false);
  return true;
}

Assistant:

bool emit_find_high_bit_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This is actually CLZ, and not FindMSB.
	auto *value = instruction->getOperand(1);
	spv::Id msb_id = emit_native_bitscan(opcode, impl, nullptr, value);

	Operation *eq_neg1_op = impl.allocate(spv::OpIEqual, builder.makeBoolType());
	{
		eq_neg1_op->add_ids({ msb_id, builder.makeUintConstant(~0u) });
		impl.add(eq_neg1_op);
	}

	Operation *msb_sub_op = impl.allocate(spv::OpISub, impl.get_type_id(instruction->getType()));
	{
		msb_sub_op->add_ids({
		    builder.makeUintConstant(value->getType()->getIntegerBitWidth() - 1),
		    msb_id
		});
		impl.add(msb_sub_op);
	}

	Operation *op = impl.allocate(spv::OpSelect, instruction);
	op->add_ids({ eq_neg1_op->id, builder.makeUintConstant(~0u), msb_sub_op->id });
	impl.add(op);
	return true;
}